

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O1

void jpeg_calc_output_dimensions(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  jpeg_component_info *pjVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  boolean bVar9;
  long lVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  jpeg_component_info *pjVar16;
  int iVar17;
  JDIMENSION *pJVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  
  iVar8 = cinfo->global_state;
  if (iVar8 != 0xca) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x14;
    (pjVar1->msg_parm).i[0] = iVar8;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar12 = cinfo->scale_denom;
  uVar7 = cinfo->scale_num << 3;
  if (uVar12 < uVar7) {
    if (uVar12 * 2 < uVar7) {
      if (uVar12 * 3 < uVar7) {
        if (uVar12 * 4 < uVar7) {
          if (uVar12 * 5 < uVar7) {
            if (uVar12 * 6 < uVar7) {
              if (uVar12 * 7 < uVar7) {
                if (uVar12 * 8 < uVar7) {
                  if (uVar12 * 9 < uVar7) {
                    if (uVar12 * 10 < uVar7) {
                      if (uVar12 * 0xb < uVar7) {
                        if (uVar12 * 0xc < uVar7) {
                          if (uVar12 * 0xd < uVar7) {
                            if (uVar12 * 0xe < uVar7) {
                              if (uVar12 * 0xf < uVar7) {
                                lVar10 = jdiv_round_up((ulong)cinfo->image_width << 4,8);
                                cinfo->output_width = (JDIMENSION)lVar10;
                                lVar10 = jdiv_round_up((ulong)cinfo->image_height << 4,8);
                                cinfo->output_height = (JDIMENSION)lVar10;
                                cinfo->min_DCT_scaled_size = 0x10;
                              }
                              else {
                                lVar10 = jdiv_round_up((ulong)cinfo->image_width * 0xf,8);
                                cinfo->output_width = (JDIMENSION)lVar10;
                                lVar10 = jdiv_round_up((ulong)cinfo->image_height * 0xf,8);
                                cinfo->output_height = (JDIMENSION)lVar10;
                                cinfo->min_DCT_scaled_size = 0xf;
                              }
                            }
                            else {
                              lVar10 = jdiv_round_up((ulong)cinfo->image_width * 0xe,8);
                              cinfo->output_width = (JDIMENSION)lVar10;
                              lVar10 = jdiv_round_up((ulong)cinfo->image_height * 0xe,8);
                              cinfo->output_height = (JDIMENSION)lVar10;
                              cinfo->min_DCT_scaled_size = 0xe;
                            }
                          }
                          else {
                            lVar10 = jdiv_round_up((ulong)cinfo->image_width * 0xd,8);
                            cinfo->output_width = (JDIMENSION)lVar10;
                            lVar10 = jdiv_round_up((ulong)cinfo->image_height * 0xd,8);
                            cinfo->output_height = (JDIMENSION)lVar10;
                            cinfo->min_DCT_scaled_size = 0xd;
                          }
                        }
                        else {
                          lVar10 = jdiv_round_up((ulong)cinfo->image_width * 0xc,8);
                          cinfo->output_width = (JDIMENSION)lVar10;
                          lVar10 = jdiv_round_up((ulong)cinfo->image_height * 0xc,8);
                          cinfo->output_height = (JDIMENSION)lVar10;
                          cinfo->min_DCT_scaled_size = 0xc;
                        }
                      }
                      else {
                        lVar10 = jdiv_round_up((ulong)cinfo->image_width * 0xb,8);
                        cinfo->output_width = (JDIMENSION)lVar10;
                        lVar10 = jdiv_round_up((ulong)cinfo->image_height * 0xb,8);
                        cinfo->output_height = (JDIMENSION)lVar10;
                        cinfo->min_DCT_scaled_size = 0xb;
                      }
                    }
                    else {
                      lVar10 = jdiv_round_up((ulong)cinfo->image_width * 10,8);
                      cinfo->output_width = (JDIMENSION)lVar10;
                      lVar10 = jdiv_round_up((ulong)cinfo->image_height * 10,8);
                      cinfo->output_height = (JDIMENSION)lVar10;
                      cinfo->min_DCT_scaled_size = 10;
                    }
                  }
                  else {
                    lVar10 = jdiv_round_up((ulong)cinfo->image_width * 9,8);
                    cinfo->output_width = (JDIMENSION)lVar10;
                    lVar10 = jdiv_round_up((ulong)cinfo->image_height * 9,8);
                    cinfo->output_height = (JDIMENSION)lVar10;
                    cinfo->min_DCT_scaled_size = 9;
                  }
                }
                else {
                  lVar10 = jdiv_round_up((ulong)cinfo->image_width << 3,8);
                  cinfo->output_width = (JDIMENSION)lVar10;
                  lVar10 = jdiv_round_up((ulong)cinfo->image_height << 3,8);
                  cinfo->output_height = (JDIMENSION)lVar10;
                  cinfo->min_DCT_scaled_size = 8;
                }
              }
              else {
                lVar10 = jdiv_round_up((ulong)cinfo->image_width * 7,8);
                cinfo->output_width = (JDIMENSION)lVar10;
                lVar10 = jdiv_round_up((ulong)cinfo->image_height * 7,8);
                cinfo->output_height = (JDIMENSION)lVar10;
                cinfo->min_DCT_scaled_size = 7;
              }
            }
            else {
              lVar10 = jdiv_round_up((ulong)cinfo->image_width * 6,8);
              cinfo->output_width = (JDIMENSION)lVar10;
              lVar10 = jdiv_round_up((ulong)cinfo->image_height * 6,8);
              cinfo->output_height = (JDIMENSION)lVar10;
              cinfo->min_DCT_scaled_size = 6;
            }
          }
          else {
            lVar10 = jdiv_round_up((ulong)cinfo->image_width * 5,8);
            cinfo->output_width = (JDIMENSION)lVar10;
            lVar10 = jdiv_round_up((ulong)cinfo->image_height * 5,8);
            cinfo->output_height = (JDIMENSION)lVar10;
            cinfo->min_DCT_scaled_size = 5;
          }
        }
        else {
          lVar10 = jdiv_round_up((ulong)cinfo->image_width << 2,8);
          cinfo->output_width = (JDIMENSION)lVar10;
          lVar10 = jdiv_round_up((ulong)cinfo->image_height << 2,8);
          cinfo->output_height = (JDIMENSION)lVar10;
          cinfo->min_DCT_scaled_size = 4;
        }
      }
      else {
        lVar10 = jdiv_round_up((ulong)cinfo->image_width * 3,8);
        cinfo->output_width = (JDIMENSION)lVar10;
        lVar10 = jdiv_round_up((ulong)cinfo->image_height * 3,8);
        cinfo->output_height = (JDIMENSION)lVar10;
        cinfo->min_DCT_scaled_size = 3;
      }
    }
    else {
      lVar10 = jdiv_round_up((ulong)cinfo->image_width * 2,8);
      cinfo->output_width = (JDIMENSION)lVar10;
      lVar10 = jdiv_round_up((ulong)cinfo->image_height * 2,8);
      cinfo->output_height = (JDIMENSION)lVar10;
      cinfo->min_DCT_scaled_size = 2;
    }
  }
  else {
    lVar10 = jdiv_round_up((ulong)cinfo->image_width,8);
    cinfo->output_width = (JDIMENSION)lVar10;
    lVar10 = jdiv_round_up((ulong)cinfo->image_height,8);
    cinfo->output_height = (JDIMENSION)lVar10;
    cinfo->min_DCT_scaled_size = 1;
  }
  auVar6 = _DAT_00136fc0;
  auVar5 = _DAT_001369e0;
  auVar4 = _DAT_001369d0;
  iVar8 = cinfo->num_components;
  if (0 < (long)iVar8) {
    iVar13 = cinfo->min_DCT_scaled_size;
    lVar10 = (long)iVar8 + -1;
    auVar19._8_4_ = (int)lVar10;
    auVar19._0_8_ = lVar10;
    auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
    piVar11 = &cinfo->comp_info->DCT_scaled_size;
    uVar14 = 0;
    auVar19 = auVar19 ^ _DAT_001369e0;
    do {
      auVar20._8_4_ = (int)uVar14;
      auVar20._0_8_ = uVar14;
      auVar20._12_4_ = (int)(uVar14 >> 0x20);
      auVar21 = (auVar20 | auVar4) ^ auVar5;
      iVar15 = auVar19._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar15 && auVar19._0_4_ < auVar21._0_4_ ||
                  iVar15 < auVar21._4_4_) & 1)) {
        *piVar11 = iVar13;
      }
      if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
          auVar21._12_4_ <= auVar19._12_4_) {
        piVar11[0x18] = iVar13;
      }
      auVar20 = (auVar20 | auVar6) ^ auVar5;
      iVar22 = auVar20._4_4_;
      if (iVar22 <= iVar15 && (iVar22 != iVar15 || auVar20._0_4_ <= auVar19._0_4_)) {
        piVar11[0x30] = iVar13;
        piVar11[0x48] = iVar13;
      }
      uVar14 = uVar14 + 4;
      piVar11 = piVar11 + 0x60;
    } while ((iVar8 + 3U & 0xfffffffc) != uVar14);
  }
  pjVar2 = cinfo->comp_info;
  if (0 < iVar8) {
    iVar13 = cinfo->min_DCT_scaled_size;
    iVar15 = 0;
    pjVar16 = pjVar2;
    do {
      iVar22 = iVar13;
      if (iVar13 < 8) {
        iVar17 = iVar13;
        do {
          iVar22 = iVar17;
          if (((cinfo->max_h_samp_factor * iVar13) % (iVar17 * pjVar16->h_samp_factor * 2) != 0) ||
             ((cinfo->max_v_samp_factor * iVar13) % (pjVar16->v_samp_factor * iVar17 * 2) != 0))
          break;
          iVar22 = iVar17 * 2;
          bVar3 = iVar17 < 4;
          iVar17 = iVar22;
        } while (bVar3);
      }
      pjVar16->DCT_scaled_size = iVar22;
      iVar15 = iVar15 + 1;
      pjVar16 = pjVar16 + 1;
    } while (iVar15 != iVar8);
  }
  iVar8 = cinfo->num_components;
  if (0 < iVar8) {
    pJVar18 = &pjVar2->downsampled_height;
    iVar13 = 0;
    do {
      lVar10 = jdiv_round_up((long)(int)pJVar18[-2] * (long)(int)pJVar18[-9] *
                             (ulong)cinfo->image_width,(long)cinfo->max_h_samp_factor << 3);
      pJVar18[-1] = (JDIMENSION)lVar10;
      lVar10 = jdiv_round_up((long)(int)pJVar18[-2] * (long)(int)pJVar18[-8] *
                             (ulong)cinfo->image_height,(long)cinfo->max_v_samp_factor << 3);
      *pJVar18 = (JDIMENSION)lVar10;
      iVar13 = iVar13 + 1;
      iVar8 = cinfo->num_components;
      pJVar18 = pJVar18 + 0x18;
    } while (iVar13 < iVar8);
  }
  uVar12 = cinfo->out_color_space - JCS_GRAYSCALE;
  if (uVar12 < 0x10) {
    iVar8 = *(int *)(&DAT_00137034 + (ulong)uVar12 * 4);
  }
  cinfo->out_color_components = iVar8;
  iVar13 = 1;
  iVar8 = 1;
  if (cinfo->quantize_colors == 0) {
    iVar8 = cinfo->out_color_components;
  }
  cinfo->output_components = iVar8;
  bVar9 = use_merged_upsample(cinfo);
  if (bVar9 != 0) {
    iVar13 = cinfo->max_v_samp_factor;
  }
  cinfo->rec_outbuf_height = iVar13;
  return;
}

Assistant:

GLOBAL(void)
jpeg_calc_output_dimensions(j_decompress_ptr cinfo)
/* Do computations that are needed before master selection phase */
{
#ifdef IDCT_SCALING_SUPPORTED
  int ci;
  jpeg_component_info *compptr;
#endif

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Compute core output image dimensions and DCT scaling choices. */
  jpeg_core_output_dimensions(cinfo);

#ifdef IDCT_SCALING_SUPPORTED

  /* In selecting the actual DCT scaling for each component, we try to
   * scale up the chroma components via IDCT scaling rather than upsampling.
   * This saves time if the upsampler gets to use 1:1 scaling.
   * Note this code adapts subsampling ratios which are powers of 2.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int ssize = cinfo->_min_DCT_scaled_size;
    while (ssize < DCTSIZE &&
           ((cinfo->max_h_samp_factor * cinfo->_min_DCT_scaled_size) %
            (compptr->h_samp_factor * ssize * 2) == 0) &&
           ((cinfo->max_v_samp_factor * cinfo->_min_DCT_scaled_size) %
            (compptr->v_samp_factor * ssize * 2) == 0)) {
      ssize = ssize * 2;
    }
#if JPEG_LIB_VERSION >= 70
    compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size = ssize;
#else
    compptr->DCT_scaled_size = ssize;
#endif
  }

  /* Recompute downsampled dimensions of components;
   * application needs to know these if using raw downsampled data.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Size in samples, after IDCT scaling */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_width *
                    (long)(compptr->h_samp_factor * compptr->_DCT_scaled_size),
                    (long)(cinfo->max_h_samp_factor * DCTSIZE));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_height *
                    (long)(compptr->v_samp_factor * compptr->_DCT_scaled_size),
                    (long)(cinfo->max_v_samp_factor * DCTSIZE));
  }

#else /* !IDCT_SCALING_SUPPORTED */

  /* Hardwire it to "no scaling" */
  cinfo->output_width = cinfo->image_width;
  cinfo->output_height = cinfo->image_height;
  /* jdinput.c has already initialized DCT_scaled_size to DCTSIZE,
   * and has computed unscaled downsampled_width and downsampled_height.
   */

#endif /* IDCT_SCALING_SUPPORTED */

  /* Report number of components in selected colorspace. */
  /* Probably this should be in the color conversion module... */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    cinfo->out_color_components = rgb_pixelsize[cinfo->out_color_space];
    break;
  case JCS_YCbCr:
  case JCS_RGB565:
    cinfo->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    cinfo->out_color_components = 4;
    break;
  default:                      /* else must be same colorspace as in file */
    cinfo->out_color_components = cinfo->num_components;
    break;
  }
  cinfo->output_components = (cinfo->quantize_colors ? 1 :
                              cinfo->out_color_components);

  /* See if upsampler will want to emit more than one row at a time */
  if (use_merged_upsample(cinfo))
    cinfo->rec_outbuf_height = cinfo->max_v_samp_factor;
  else
    cinfo->rec_outbuf_height = 1;
}